

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_sha2.c
# Opt level: O0

void cmSHA256_Update(SHA_CTX *context,sha_byte *data,size_t len)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint usedspace;
  uint freespace;
  size_t len_local;
  sha_byte *data_local;
  SHA_CTX *context_local;
  
  if (len != 0) {
    if ((context == (SHA_CTX *)0x0) || (data == (sha_byte *)0x0)) {
      __assert_fail("context != (SHA_CTX*)0 && data != (sha_byte*)0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cm_sha2.c"
                    ,0x3e1,"void cmSHA256_Update(SHA_CTX *, const sha_byte *, size_t)");
    }
    uVar3 = (context->s256).bitcount >> 3;
    uVar1 = (uint)uVar3 & 0x3f;
    _usedspace = len;
    len_local = (size_t)data;
    if ((uVar3 & 0x3f) != 0) {
      uVar2 = 0x40 - uVar1;
      if (len < uVar2) {
        memcpy((void *)((long)context + (ulong)uVar1 + 0x28),data,len);
        (context->s256).bitcount = len * 8 + (context->s256).bitcount;
        return;
      }
      memcpy((void *)((long)context + (ulong)uVar1 + 0x28),data,(ulong)uVar2);
      (context->s256).bitcount = (ulong)(uVar2 * 8) + (context->s256).bitcount;
      _usedspace = len - uVar2;
      len_local = (size_t)(data + uVar2);
      cmSHA256_Internal_Transform(context,(sha_word32 *)((context->s1).buffer + 8));
    }
    for (; 0x3f < _usedspace; _usedspace = _usedspace - 0x40) {
      cmSHA256_Internal_Transform(context,(sha_word32 *)len_local);
      (context->s256).bitcount = (context->s256).bitcount + 0x200;
      len_local = len_local + 0x40;
    }
    if (_usedspace != 0) {
      memcpy((context->s1).buffer + 8,(void *)len_local,_usedspace);
      (context->s256).bitcount = _usedspace * 8 + (context->s256).bitcount;
    }
  }
  return;
}

Assistant:

void SHA256_Update(SHA_CTX* context, const sha_byte *data, size_t len) {
	unsigned int	freespace, usedspace;

	if (len == 0) {
		/* Calling with no data is valid - we do nothing */
		return;
	}

	/* Sanity check: */
	assert(context != (SHA_CTX*)0 && data != (sha_byte*)0);

	usedspace = (unsigned int)((context->s256.bitcount >> 3) % 64);
	if (usedspace > 0) {
		/* Calculate how much free space is available in the buffer */
		freespace = 64 - usedspace;

		if (len >= freespace) {
			/* Fill the buffer completely and process it */
			MEMCPY_BCOPY(&context->s256.buffer[usedspace], data, freespace);
			context->s256.bitcount += freespace << 3;
			len -= freespace;
			data += freespace;
			SHA256_Internal_Transform(context, (const sha_word32*)context->s256.buffer);
		} else {
			/* The buffer is not yet full */
			MEMCPY_BCOPY(&context->s256.buffer[usedspace], data, len);
			context->s256.bitcount += len << 3;
			/* Clean up: */
			usedspace = freespace = 0;
			return;
		}
	}
	while (len >= 64) {
		/* Process as many complete blocks as we can */
		SHA256_Internal_Transform(context, (const sha_word32*)data);
		context->s256.bitcount += 512;
		len -= 64;
		data += 64;
	}
	if (len > 0) {
		/* There's left-overs, so save 'em */
		MEMCPY_BCOPY(context->s256.buffer, data, len);
		context->s256.bitcount += len << 3;
	}
	/* Clean up: */
	usedspace = freespace = 0;
}